

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Monomorphize.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_0::Monomorphize::run(Monomorphize *this,Module *module)

{
  bool bVar1;
  reference pNVar2;
  Function *pFVar3;
  Module **this_00;
  mapped_type *pmVar4;
  Function *local_1e8;
  BasicType local_1dc;
  reference local_1d8;
  CallInfo *info;
  iterator __end3;
  iterator __begin3;
  vector<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
  *__range3;
  CallFinder callFinder;
  Function *func;
  Name name;
  iterator __end2;
  iterator __begin2;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *__range2;
  undefined1 local_68 [8];
  vector<wasm::Name,_std::allocator<wasm::Name>_> funcNames;
  ReturnCallersMap returnCallersMap;
  Module *module_local;
  Monomorphize *this_local;
  
  applyArguments(this);
  ReturnUtils::findReturnCallers
            ((unordered_map<wasm::Function_*,_bool,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_bool>_>_>
              *)&funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,module);
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
            ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)local_68);
  wasm::ModuleUtils::
  iterDefinedFunctions<wasm::(anonymous_namespace)::Monomorphize::run(wasm::Module*)::_lambda(wasm::Function*)_1_>
            (module,(vector<wasm::Name,_std::allocator<wasm::Name>_> *)local_68);
  __end2 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::begin
                     ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)local_68);
  name.super_IString.str._M_str =
       (char *)std::vector<wasm::Name,_std::allocator<wasm::Name>_>::end
                         ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)local_68);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                                     *)&name.super_IString.str._M_str), bVar1) {
    pNVar2 = __gnu_cxx::
             __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
             ::operator*(&__end2);
    callFinder.infos.
    super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pNVar2->super_IString).str._M_len
    ;
    name.super_IString.str._M_len = (size_t)(pNVar2->super_IString).str._M_str;
    func = (Function *)
           callFinder.infos.
           super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pFVar3 = Module::getFunction(module,(Name)(pNVar2->super_IString).str);
    CallFinder::CallFinder((CallFinder *)&__range3);
    Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
    ::walk((Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
            *)&__range3,&pFVar3->body);
    this_00 = &callFinder.
               super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
               .
               super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
               .currModule;
    __end3 = std::
             vector<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
             ::begin((vector<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                      *)this_00);
    info = (CallInfo *)
           std::
           vector<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
           ::end((vector<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                  *)this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<wasm::(anonymous_namespace)::CallInfo_*,_std::vector<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>_>
                                       *)&info), bVar1) {
      local_1d8 = __gnu_cxx::
                  __normal_iterator<wasm::(anonymous_namespace)::CallInfo_*,_std::vector<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>_>
                  ::operator*(&__end3);
      local_1dc = unreachable;
      bVar1 = wasm::Type::operator==
                        (&(local_1d8->call->super_SpecificExpression<(wasm::Expression::Id)6>).
                          super_Expression.type,&local_1dc);
      if ((!bVar1) &&
         (bVar1 = IString::operator==(&(local_1d8->call->target).super_IString,(IString *)&func),
         !bVar1)) {
        local_1e8 = Module::getFunction(module,(Name)(local_1d8->call->target).super_IString.str);
        pmVar4 = std::
                 unordered_map<wasm::Function_*,_bool,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_bool>_>_>
                 ::operator[]((unordered_map<wasm::Function_*,_bool,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_bool>_>_>
                               *)&funcNames.
                                  super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_1e8);
        if ((*pmVar4 & 1U) != 0) {
          local_1d8->drop = (Expression **)0x0;
        }
        processCall(this,local_1d8,module);
      }
      __gnu_cxx::
      __normal_iterator<wasm::(anonymous_namespace)::CallInfo_*,_std::vector<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>_>
      ::operator++(&__end3);
    }
    CallFinder::~CallFinder((CallFinder *)&__range3);
    __gnu_cxx::
    __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::
    operator++(&__end2);
  }
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::~vector
            ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)local_68);
  std::
  unordered_map<wasm::Function_*,_bool,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_bool>_>_>
  ::~unordered_map((unordered_map<wasm::Function_*,_bool,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_bool>_>_>
                    *)&funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void run(Module* module) override {
    // TODO: parallelize, see comments below

    applyArguments();

    // Find all the return-calling functions. We cannot remove their returns
    // (because turning a return call into a normal call may break the program
    // by using more stack).
    auto returnCallersMap = ReturnUtils::findReturnCallers(*module);

    // Note the list of all functions. We'll be adding more, and do not want to
    // operate on those.
    std::vector<Name> funcNames;
    ModuleUtils::iterDefinedFunctions(
      *module, [&](Function* func) { funcNames.push_back(func->name); });

    // Find the calls in each function and optimize where we can, changing them
    // to call the monomorphized targets.
    for (auto name : funcNames) {
      auto* func = module->getFunction(name);

      CallFinder callFinder;
      callFinder.walk(func->body);
      for (auto& info : callFinder.infos) {
        if (info.call->type == Type::unreachable) {
          // Ignore unreachable code.
          // TODO: return_call?
          continue;
        }

        if (info.call->target == name) {
          // Avoid recursion, which adds some complexity (as we'd be modifying
          // ourselves if we apply optimizations).
          continue;
        }

        // If the target function does a return call, then as noted earlier we
        // cannot remove its returns, so do not consider the drop as part of the
        // context in such cases (as if we reverse-inlined the drop into the
        // target then we'd be removing the returns).
        if (returnCallersMap[module->getFunction(info.call->target)]) {
          info.drop = nullptr;
        }

        processCall(info, *module);
      }
    }
  }